

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendedKalmanFilter.cpp
# Opt level: O0

bool __thiscall
iDynTree::DiscreteExtendedKalmanFilterHelper::ekfReset
          (DiscreteExtendedKalmanFilterHelper *this,size_t *state_size,size_t *input_size,
          size_t *output_size,Span<double,__1L> *x0,Span<double,__1L> *P0,Span<double,__1L> *Q,
          Span<double,__1L> *R)

{
  bool bVar1;
  DiscreteExtendedKalmanFilterHelper *in_RCX;
  size_t *in_RDI;
  DiscreteExtendedKalmanFilterHelper *in_R8;
  size_t *in_R9;
  Span<double,__1L> *unaff_retaddr;
  DiscreteExtendedKalmanFilterHelper *in_stack_00000008;
  size_t *in_stack_ffffffffffffffb8;
  bool local_1;
  
  *(undefined1 *)(in_RDI + 0x3c) = 0;
  *(undefined1 *)((long)in_RDI + 0x1e1) = 0;
  *(undefined1 *)((long)in_RDI + 0x1e2) = 0;
  *(undefined1 *)((long)in_RDI + 0x1e3) = 0;
  *(undefined1 *)((long)in_RDI + 0x1e4) = 0;
  bVar1 = ekfInit(in_R8,in_R9,in_RDI,in_stack_ffffffffffffffb8);
  if (bVar1) {
    bVar1 = ekfSetInitialState(in_RCX,(Span<double,__1L> *)in_R8);
    if (bVar1) {
      bVar1 = ekfSetStateCovariance(in_stack_00000008,unaff_retaddr);
      if (bVar1) {
        bVar1 = ekfSetSystemNoiseCovariance(in_stack_00000008,unaff_retaddr);
        if (bVar1) {
          bVar1 = ekfSetMeasurementNoiseCovariance(in_stack_00000008,unaff_retaddr);
          if (bVar1) {
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool iDynTree::DiscreteExtendedKalmanFilterHelper::ekfReset(const size_t& state_size, const size_t& input_size, const size_t& output_size,
                                                                                                        const iDynTree::Span<double>& x0, const iDynTree::Span<double>& P0,
                                                                                                        const iDynTree::Span<double>& Q, const iDynTree::Span<double>& R)
{
    m_is_initialized = false;
    m_measurement_updated = false;
    m_input_updated = false;
    m_initial_state_set = false;
    m_initial_state_covariance_set = false;

    if (!ekfInit(state_size, input_size, output_size))
    {
        return false;
    }

    if (!ekfSetInitialState(x0))
    {
        return false;
    }

    if (!ekfSetStateCovariance(P0))
    {
        return false;
    }

    if (!ekfSetSystemNoiseCovariance(Q))
    {
        return false;
    }

    if (!ekfSetMeasurementNoiseCovariance(R))
    {
        return false;
    }

    return true;
}